

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_free_mc_tmp_buf(ThreadData *thread_data)

{
  long in_RDI;
  int i;
  int ref;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    if (*(int *)(in_RDI + 0x3eb84) == 0) {
      aom_free((void *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    }
    else {
      aom_free((void *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    }
    *(undefined8 *)(in_RDI + 0x3eb68 + (long)iVar2 * 8) = 0;
  }
  *(undefined4 *)(in_RDI + 0x3eb80) = 0;
  *(undefined4 *)(in_RDI + 0x3eb84) = 0;
  aom_free((void *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x3eb88) = 0;
  aom_free((void *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x3eb78) = 0;
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(iVar2,iVar1));
    *(undefined8 *)(in_RDI + 0x3eb90 + (long)iVar1 * 8) = 0;
  }
  return;
}

Assistant:

void av1_free_mc_tmp_buf(ThreadData *thread_data) {
  int ref;
  for (ref = 0; ref < 2; ref++) {
    if (thread_data->mc_buf_use_highbd)
      aom_free(CONVERT_TO_SHORTPTR(thread_data->mc_buf[ref]));
    else
      aom_free(thread_data->mc_buf[ref]);
    thread_data->mc_buf[ref] = NULL;
  }
  thread_data->mc_buf_size = 0;
  thread_data->mc_buf_use_highbd = 0;

  aom_free(thread_data->tmp_conv_dst);
  thread_data->tmp_conv_dst = NULL;
  aom_free(thread_data->seg_mask);
  thread_data->seg_mask = NULL;
  for (int i = 0; i < 2; ++i) {
    aom_free(thread_data->tmp_obmc_bufs[i]);
    thread_data->tmp_obmc_bufs[i] = NULL;
  }
}